

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int indexColumnIsBeingUpdated(Index *pIdx,int iCol,int *aXRef,int chngRowid)

{
  i16 iIdxCol;
  int chngRowid_local;
  int *aXRef_local;
  int iCol_local;
  Index *pIdx_local;
  
  if (pIdx->aiColumn[iCol] < 0) {
    pIdx_local._4_4_ =
         sqlite3ExprReferencesUpdatedColumn(pIdx->aColExpr->a[iCol].pExpr,aXRef,chngRowid);
  }
  else {
    pIdx_local._4_4_ = (uint)(-1 < aXRef[pIdx->aiColumn[iCol]]);
  }
  return pIdx_local._4_4_;
}

Assistant:

static int indexColumnIsBeingUpdated(
  Index *pIdx,      /* The index to check */
  int iCol,         /* Which column of the index to check */
  int *aXRef,       /* aXRef[j]>=0 if column j is being updated */
  int chngRowid     /* true if the rowid is being updated */
){
  i16 iIdxCol = pIdx->aiColumn[iCol];
  assert( iIdxCol!=XN_ROWID ); /* Cannot index rowid */
  if( iIdxCol>=0 ){
    return aXRef[iIdxCol]>=0;
  }
  assert( iIdxCol==XN_EXPR );
  assert( pIdx->aColExpr!=0 );
  assert( pIdx->aColExpr->a[iCol].pExpr!=0 );
  return sqlite3ExprReferencesUpdatedColumn(pIdx->aColExpr->a[iCol].pExpr,
                                            aXRef,chngRowid);
}